

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O2

int32 rw::getSizeNativeData(void *object,int32 offset,int32 size)

{
  int32 iVar1;
  
  if (*(undefined4 **)((long)object + 0x98) != (undefined4 *)0x0) {
    switch(**(undefined4 **)((long)object + 0x98)) {
    case 4:
      iVar1 = ps2::getSizeNativeData(object,offset,size);
      return iVar1;
    case 5:
      iVar1 = xbox::getSizeNativeData(object,offset,size);
      return iVar1;
    case 8:
      iVar1 = d3d8::getSizeNativeData(object,offset,size);
      return iVar1;
    case 9:
      iVar1 = d3d9::getSizeNativeData(object,offset,size);
      return iVar1;
    case 0xb:
      iVar1 = wdgl::getSizeNativeData(object,offset,size);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int32
getSizeNativeData(void *object, int32 offset, int32 size)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return 0;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::getSizeNativeData(object, offset, size);
	return 0;
}